

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O1

void __thiscall format_escapes_Test::~format_escapes_Test(format_escapes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(format, escapes)
{
    EXPECT_EQ(ST_LITERAL("{x"), ST::format("{{{}", "x"));
    EXPECT_EQ(ST_LITERAL("x{"), ST::format("{}{{", "x"));
    EXPECT_EQ(ST_LITERAL("{{{{"), ST::format("{{{}{{{{", "{"));
    EXPECT_EQ(ST_LITERAL("{xxx{{yyy{"), ST::format("{{{}{{{{{}{{", "xxx", "yyy"));

    // Both single and double '}' are a valid escape for '}'
    EXPECT_EQ(ST_LITERAL("}"), ST::format("}"));
    EXPECT_EQ(ST_LITERAL("}"), ST::format("}}"));
    EXPECT_EQ(ST_LITERAL("{}"), ST::format("{{}"));
    EXPECT_EQ(ST_LITERAL("{}"), ST::format("{{}}"));
    EXPECT_EQ(ST_LITERAL("x}"), ST::format("{}}", "x"));
    EXPECT_EQ(ST_LITERAL("x}"), ST::format("{}}}", "x"));
    EXPECT_EQ(ST_LITERAL("{x}"), ST::format("{{{}}", "x"));
    EXPECT_EQ(ST_LITERAL("{x}"), ST::format("{{{}}}", "x"));
    EXPECT_EQ(ST_LITERAL("}}}x}"), ST::format("{>4_}}}", "x"));
    EXPECT_EQ(ST_LITERAL("}}}x}"), ST::format("{>4_}}}}", "x"));

    EXPECT_EQ(ST_LITERAL("}x"), ST::format("}x"));
    EXPECT_EQ(ST_LITERAL("}x"), ST::format("}}x"));
    EXPECT_EQ(ST_LITERAL("{}x"), ST::format("{{}x"));
    EXPECT_EQ(ST_LITERAL("{}x"), ST::format("{{}}x"));
    EXPECT_EQ(ST_LITERAL("x}x"), ST::format("{}}x", "x"));
    EXPECT_EQ(ST_LITERAL("x}x"), ST::format("{}}}x", "x"));
}